

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

void Fra_ClassesPrepare(Fra_Cla_t *p,int fLatchCorr,int nMaxLevs)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  void *__s;
  void *__s_00;
  void **ppvVar7;
  long lVar8;
  Aig_Obj_t **ppAVar9;
  Vec_Ptr_t *pVVar10;
  int iVar11;
  ulong uVar12;
  Aig_Obj_t *pAVar13;
  size_t __size;
  uint uVar14;
  uint uVar15;
  long lVar16;
  
  uVar15 = p->pAig->vObjs->nSize - 1;
  while( true ) {
    do {
      uVar14 = uVar15;
      uVar15 = uVar14 + 1;
    } while ((uVar14 & 1) != 0);
    if (uVar15 < 9) break;
    iVar11 = 5;
    while (uVar15 % (iVar11 - 2U) != 0) {
      uVar4 = iVar11 * iVar11;
      iVar11 = iVar11 + 2;
      if (uVar15 < uVar4) goto LAB_005f0daa;
    }
  }
LAB_005f0daa:
  __size = (long)(int)uVar15 << 3;
  __s = malloc(__size);
  memset(__s,0xff,__size);
  __s_00 = malloc(__size);
  memset(__s_00,0xff,__size);
  iVar11 = 0;
  memset(__s,0,__size);
  p->vClasses1->nSize = 0;
  pVVar10 = p->pAig->vObjs;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar10->pArray[lVar16];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        uVar4 = (uint)*(undefined8 *)&pAVar2->field_0x18;
        if (fLatchCorr == 0) {
          uVar4 = uVar4 & 7;
          if (((uVar4 == 2) || (uVar4 - 5 < 2)) &&
             ((nMaxLevs == 0 ||
              ((int)((uint)((ulong)*(undefined8 *)&pAVar2->field_0x18 >> 0x20) & 0xffffff) <=
               nMaxLevs)))) goto LAB_005f0e49;
        }
        else if ((uVar4 & 7) == 2) {
LAB_005f0e49:
          iVar5 = (*p->pFuncNodeHash)(pAVar2,uVar15);
          iVar6 = (*p->pFuncNodeIsConst)(pAVar2);
          if (iVar6 == 0) {
            lVar8 = *(long *)((long)__s + (long)iVar5 * 8);
            if (lVar8 == 0) {
              *(Aig_Obj_t **)((long)__s + (long)iVar5 * 8) = pAVar2;
              lVar8 = (long)pAVar2->Id;
            }
            else {
              lVar8 = (long)*(int *)(lVar8 + 0x24);
              *(undefined8 *)((long)__s_00 + (long)pAVar2->Id * 8) =
                   *(undefined8 *)((long)__s_00 + lVar8 * 8);
            }
            *(Aig_Obj_t **)((long)__s_00 + lVar8 * 8) = pAVar2;
          }
          else {
            pVVar10 = p->vClasses1;
            uVar4 = pVVar10->nCap;
            if (pVVar10->nSize == uVar4) {
              if ((int)uVar4 < 0x10) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
                }
                pVVar10->pArray = ppvVar7;
                iVar5 = 0x10;
              }
              else {
                iVar5 = uVar4 * 2;
                if (iVar5 <= (int)uVar4) goto LAB_005f0f55;
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar4 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar4 << 4);
                }
                pVVar10->pArray = ppvVar7;
              }
              pVVar10->nCap = iVar5;
            }
LAB_005f0f55:
            iVar5 = pVVar10->nSize;
            pVVar10->nSize = iVar5 + 1;
            pVVar10->pArray[iVar5] = pAVar2;
            *(Aig_Obj_t **)
             (*(long *)(*(long *)((long)(pAVar2->field_5).pData + 0x30) + 8) + (long)pAVar2->Id * 8)
                 = p->pAig->pConst1;
          }
        }
      }
      lVar16 = lVar16 + 1;
      pVVar10 = p->pAig->vObjs;
    } while (lVar16 < pVVar10->nSize);
  }
  if (uVar14 < 0x7fffffff) {
    uVar12 = 0;
    iVar11 = 0;
    do {
      lVar16 = *(long *)((long)__s + uVar12 * 8);
      if ((lVar16 != 0) &&
         (lVar8 = *(long *)((long)__s_00 + (long)*(int *)(lVar16 + 0x24) * 8), lVar16 != lVar8)) {
        iVar11 = iVar11 + 1;
        do {
          lVar8 = *(long *)((long)__s_00 + (long)*(int *)(lVar8 + 0x24) * 8);
          iVar11 = iVar11 + 1;
        } while (lVar8 != lVar16);
        if ((*(ulong *)(lVar16 + 0x18) & 0x10) != 0) {
          __assert_fail("ppTable[i]->fMarkA == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                        ,0x153,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
        }
        *(ulong *)(lVar16 + 0x18) = *(ulong *)(lVar16 + 0x18) | 0x10;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar15);
  }
  ppAVar9 = (Aig_Obj_t **)malloc(((long)p->vClasses1->nSize + (long)iVar11) * 0x10);
  p->pMemClasses = ppAVar9;
  p->pMemClassesFree = ppAVar9 + (uint)(iVar11 * 2);
  p->vClasses->nSize = 0;
  pVVar10 = p->pAig->vObjs;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    iVar11 = 0;
    do {
      pAVar2 = (Aig_Obj_t *)pVVar10->pArray[lVar16];
      if (pAVar2 != (Aig_Obj_t *)0x0) {
        uVar12 = *(ulong *)&pAVar2->field_0x18;
        if (((uint)uVar12 & 7) - 7 < 0xfffffffe) {
          if (((uint)uVar12 & 0x17) == 0x12) {
LAB_005f107c:
            *(ulong *)&pAVar2->field_0x18 = uVar12 & 0xffffffffffffffef;
            iVar5 = iVar11 * 2;
            ppAVar9 = p->pMemClasses;
            pVVar10 = p->vClasses;
            uVar15 = pVVar10->nCap;
            if (pVVar10->nSize == uVar15) {
              if ((int)uVar15 < 0x10) {
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc(0x80);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar10->pArray,0x80);
                }
                pVVar10->pArray = ppvVar7;
                iVar6 = 0x10;
              }
              else {
                iVar6 = uVar15 * 2;
                if (iVar6 <= (int)uVar15) goto LAB_005f1149;
                if (pVVar10->pArray == (void **)0x0) {
                  ppvVar7 = (void **)malloc((ulong)uVar15 << 4);
                }
                else {
                  ppvVar7 = (void **)realloc(pVVar10->pArray,(ulong)uVar15 << 4);
                }
                pVVar10->pArray = ppvVar7;
              }
              pVVar10->nCap = iVar6;
            }
LAB_005f1149:
            iVar6 = pVVar10->nSize;
            pVVar10->nSize = iVar6 + 1;
            pVVar10->pArray[iVar6] = ppAVar9 + iVar5;
            uVar15 = 1;
            pAVar13 = *(Aig_Obj_t **)((long)__s_00 + (long)pAVar2->Id * 8);
            for (pAVar3 = pAVar13; pAVar3 != pAVar2;
                pAVar3 = *(Aig_Obj_t **)((long)__s_00 + (long)pAVar3->Id * 8)) {
              uVar15 = uVar15 + 1;
            }
            if (uVar15 < 2) {
              __assert_fail("nNodes > 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClass.c"
                            ,0x16d,"void Fra_ClassesPrepare(Fra_Cla_t *, int, int)");
            }
            p->pMemClasses[iVar5] = pAVar2;
            if (pAVar13 == pAVar2) {
              iVar6 = 1;
            }
            else {
              iVar6 = -1;
              do {
                p->pMemClasses[(int)(uVar15 + iVar5 + iVar6)] = pAVar13;
                iVar1 = pAVar13->Id;
                *(Aig_Obj_t **)
                 (*(long *)(*(long *)((long)(pAVar13->field_5).pData + 0x30) + 8) + (long)iVar1 * 8)
                     = pAVar2;
                pAVar13 = *(Aig_Obj_t **)((long)__s_00 + (long)iVar1 * 8);
                iVar6 = iVar6 + -1;
              } while (pAVar13 != pAVar2);
              iVar6 = -iVar6;
            }
            p->pMemClasses[(int)(uVar15 + iVar5)] = (Aig_Obj_t *)0x0;
            iVar11 = iVar6 + iVar11;
          }
        }
        else if ((uVar12 & 0x10) != 0) goto LAB_005f107c;
      }
      lVar16 = lVar16 + 1;
      pVVar10 = p->pAig->vObjs;
    } while (lVar16 < pVVar10->nSize);
  }
  if (__s != (void *)0x0) {
    free(__s);
  }
  if (__s_00 != (void *)0x0) {
    free(__s_00);
  }
  Fra_ClassesRefine(p);
  return;
}

Assistant:

void Fra_ClassesPrepare( Fra_Cla_t * p, int fLatchCorr, int nMaxLevs )
{
    Aig_Obj_t ** ppTable, ** ppNexts;
    Aig_Obj_t * pObj, * pTemp;
    int i, k, nTableSize, nEntries, nNodes, iEntry;

    // allocate the hash table hashing simulation info into nodes
    nTableSize = Abc_PrimeCudd( Aig_ManObjNumMax(p->pAig) );
    ppTable = ABC_FALLOC( Aig_Obj_t *, nTableSize ); 
    ppNexts = ABC_FALLOC( Aig_Obj_t *, nTableSize ); 
    memset( ppTable, 0, sizeof(Aig_Obj_t *) * nTableSize );

    // add all the nodes to the hash table
    Vec_PtrClear( p->vClasses1 );
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( fLatchCorr )
        {
            if ( !Aig_ObjIsCi(pObj) )
                continue;
        }
        else
        {
            if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
                continue;
            // skip the node with more that the given number of levels
            if ( nMaxLevs && (int)pObj->Level > nMaxLevs )
                continue;
        }
        // hash the node by its simulation info
        iEntry = p->pFuncNodeHash( pObj, nTableSize );
        // check if the node belongs to the class of constant 1
        if ( p->pFuncNodeIsConst( pObj ) )
        {
            Vec_PtrPush( p->vClasses1, pObj );
            Fra_ClassObjSetRepr( pObj, Aig_ManConst1(p->pAig) );
            continue;
        }
        // add the node to the class
        if ( ppTable[iEntry] == NULL )
        {
            ppTable[iEntry] = pObj;
            Fra_ObjSetNext( ppNexts, pObj, pObj );
        }
        else
        {
            Fra_ObjSetNext( ppNexts, pObj, Fra_ObjNext(ppNexts,ppTable[iEntry]) );
            Fra_ObjSetNext( ppNexts, ppTable[iEntry], pObj );
        }
    }

    // count the total number of nodes in the non-trivial classes
    // mark the representative nodes of each equivalence class
    nEntries = 0;
    for ( i = 0; i < nTableSize; i++ )
        if ( ppTable[i] && ppTable[i] != Fra_ObjNext(ppNexts, ppTable[i]) )
        {
            for ( pTemp = Fra_ObjNext(ppNexts, ppTable[i]), k = 1; 
                  pTemp != ppTable[i]; 
                  pTemp = Fra_ObjNext(ppNexts, pTemp), k++ );
            assert( k > 1 );
            nEntries += k;
            // mark the node
            assert( ppTable[i]->fMarkA == 0 );
            ppTable[i]->fMarkA = 1;
        }

    // allocate room for classes
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 2*(nEntries + Vec_PtrSize(p->vClasses1)) );
    p->pMemClassesFree = p->pMemClasses + 2*nEntries;
 
    // copy the entries into storage in the topological order
    Vec_PtrClear( p->vClasses );
    nEntries = 0;
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsNode(pObj) && !Aig_ObjIsCi(pObj) )
            continue;
        // skip the nodes that are not representatives of non-trivial classes
        if ( pObj->fMarkA == 0 )
            continue;
        pObj->fMarkA = 0;
        // add the class of nodes
        Vec_PtrPush( p->vClasses, p->pMemClasses + 2*nEntries );
        // count the number of entries in this class
        for ( pTemp = Fra_ObjNext(ppNexts, pObj), k = 1; 
              pTemp != pObj; 
              pTemp = Fra_ObjNext(ppNexts, pTemp), k++ );
        nNodes = k;
        assert( nNodes > 1 );
        // add the nodes to the class in the topological order
        p->pMemClasses[2*nEntries] = pObj;
        for ( pTemp = Fra_ObjNext(ppNexts, pObj), k = 1; 
              pTemp != pObj; 
              pTemp = Fra_ObjNext(ppNexts, pTemp), k++ )
        {
            p->pMemClasses[2*nEntries+nNodes-k] = pTemp;
            Fra_ClassObjSetRepr( pTemp, pObj );
        }
        // add as many empty entries
        p->pMemClasses[2*nEntries + nNodes] = NULL;
        // increment the number of entries
        nEntries += k;
    }
    ABC_FREE( ppTable );
    ABC_FREE( ppNexts );
    // now it is time to refine the classes
    Fra_ClassesRefine( p );
//    Fra_ClassesPrint( p, 0 );
}